

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O0

PCAPNG_RESULT pcapng_close(PCAPNG_HANDLE *handle)

{
  PCAPNG_HANDLE *handle_local;
  
  if ((handle->interface_description != (interface_description_block *)0x0) &&
     (handle->interface_description != (interface_description_block *)0xffffffffffffffff)) {
    munmap(handle->interface_description,handle->interface_description_size);
  }
  if ((handle->section_header != (section_header_block *)0x0) &&
     (handle->section_header != (section_header_block *)0xffffffffffffffff)) {
    munmap(handle->section_header,handle->section_header_size);
  }
  if (handle->fd != -1) {
    close(handle->fd);
  }
  return PCAPNG_OK;
}

Assistant:

PCAPNG_RESULT pcapng_close( PCAPNG_HANDLE * handle )
{
	if (handle->interface_description &&
	    (handle->interface_description != MAP_FAILED)) {
		(void) munmap( handle->interface_description,
			       handle->interface_description_size );
	}
	if (handle->section_header &&
	    (handle->section_header != MAP_FAILED)) {
		(void) munmap( handle->section_header,
			       handle->section_header_size );
	}
	if (handle->fd != -1) {
		(void) close( handle->fd );
	}
	return PCAPNG_OK;
}